

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

double gmlc::utilities::numConv<double>(string_view V)

{
  size_t *in_RCX;
  double dVar1;
  string_view input;
  
  input._M_len = V._M_str;
  input._M_str = (char *)0x0;
  dVar1 = strViewToFloat<double>((utilities *)V._M_len,input,in_RCX);
  return dVar1;
}

Assistant:

inline double numConv(std::string_view V)
{
#ifdef __cpp_lib_to_chars
    return strViewToFloat<double>(V);
#elif defined USE_BOOST_SPIRIT && USE_BOOST_SPIRIT > 0
    namespace x3 = boost::spirit::x3;
    double retVal = -1e49;
    x3::parse(V.cbegin(), V.cend(), x3::double_, retVal);
    return retVal;
#else
    return std::stod(std::string(V.data(), V.length()));
#endif
}